

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spend.cpp
# Opt level: O2

int wallet::CalculateMaximumSignedInputSize
              (CTxOut *txout,COutPoint outpoint,SigningProvider *provider,bool can_grind_r,
              CCoinControl *coin_control)

{
  int64_t iVar1;
  pointer *__ptr;
  int iVar2;
  long in_FS_OFFSET;
  optional<long> oVar3;
  undefined1 local_a8 [112];
  undefined1 local_38;
  long local_30;
  
  iVar2 = (int)local_a8;
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (provider != (SigningProvider *)0x0) {
    InferDescriptor((CScript *)local_a8,(SigningProvider *)&txout->scriptPubKey);
    if ((Descriptor *)local_a8._0_8_ != (Descriptor *)0x0) {
      local_38 = 0;
      oVar3 = MaxInputWeight((Descriptor *)local_a8._0_8_,(optional<CTxIn> *)(local_a8 + 8),
                             coin_control,true,can_grind_r);
      std::_Optional_payload_base<CTxIn>::_M_reset((_Optional_payload_base<CTxIn> *)(local_a8 + 8));
      if (((undefined1  [16])
           oVar3.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long> & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        iVar1 = GetVirtualTransactionSize
                          (oVar3.super__Optional_base<long,_true,_true>._M_payload.
                           super__Optional_payload_base<long>._M_payload,0,0);
        iVar2 = (int)iVar1;
      }
      if ((Descriptor *)local_a8._0_8_ != (Descriptor *)0x0) {
        (*(*(_func_int ***)local_a8._0_8_)[1])();
      }
      if (((undefined1  [16])
           oVar3.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long> & (undefined1  [16])0x1) != (undefined1  [16])0x0)
      goto LAB_0097cc16;
    }
  }
  iVar2 = -1;
LAB_0097cc16:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

int CalculateMaximumSignedInputSize(const CTxOut& txout, const COutPoint outpoint, const SigningProvider* provider, bool can_grind_r, const CCoinControl* coin_control)
{
    if (!provider) return -1;

    if (const auto desc = InferDescriptor(txout.scriptPubKey, *provider)) {
        if (const auto weight = MaxInputWeight(*desc, {}, coin_control, true, can_grind_r)) {
            return static_cast<int>(GetVirtualTransactionSize(*weight, 0, 0));
        }
    }

    return -1;
}